

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void usage(void)

{
  ostream *this;
  char *cmds;
  
  this = std::operator<<((ostream *)&std::cout,
                         "\n    b:      browse\n    c:      connect\n    d:      disconnect\n    g:      get Endpoints\n    q:      quit\n    u:      show usage\n"
                        );
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void usage() {
    const char *cmds = R"(
    b:      browse
    c:      connect
    d:      disconnect
    g:      get Endpoints
    q:      quit
    u:      show usage
)";
    std::cout << cmds << std::endl;
}